

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_manager.cpp
# Opt level: O0

uint64_t __thiscall foxxll::block_manager::free_bytes(block_manager *this)

{
  const_reference ppdVar1;
  uint64_t uVar2;
  ulong local_30;
  size_t i;
  uint64_t total;
  unique_lock<std::mutex> lock;
  block_manager *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&total,&this->mutex_);
  i = 0;
  for (local_30 = 0; local_30 < this->ndisks_; local_30 = local_30 + 1) {
    ppdVar1 = tlx::SimpleVector<foxxll::disk_block_allocator_*,_(tlx::SimpleVectorMode)0>::
              operator[](&this->block_allocators_,local_30);
    uVar2 = disk_block_allocator::free_bytes(*ppdVar1);
    i = uVar2 + i;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&total);
  return i;
}

Assistant:

uint64_t block_manager::free_bytes() const
{
    std::unique_lock<std::mutex> lock(mutex_);

    uint64_t total = 0;

    for (size_t i = 0; i < ndisks_; ++i)
        total += block_allocators_[i]->free_bytes();

    return total;
}